

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

uint32_t prf_state_color_lookup(prf_state_t *state,uint index,int intensity)

{
  prf_color_palette_data *data;
  uint32_t color;
  int intensity_local;
  uint index_local;
  prf_state_t *state_local;
  
  if ((state->color_palette == (prf_node_t *)0x0) ||
     ((int)(state->color_palette->length - 0x84) / 4 <= (int)index)) {
    color = prf_color_palette_default_values[index];
  }
  else {
    color = *(uint32_t *)(state->color_palette->data + (ulong)index * 4 + 0x80);
  }
  if ((color & 0xff000000) != 0xff000000) {
    color = prf_color_palette_default_values[index];
  }
  return color;
}

Assistant:

uint32_t
prf_state_color_lookup(
    prf_state_t * state,
    unsigned int index,
    int intensity )
{
    uint32_t color;

    assert( state != NULL );
    assert( index < 1024 );

    color = 0;

    if ( /* (intensity != 0) && */
         (state->color_palette != NULL) &&
         ((signed int) index < ((state->color_palette->length - 132) / 4)) ) {
        struct prf_color_palette_data * data;
        data = (struct prf_color_palette_data *) state->color_palette->data;
        color = data->brightest_rgb[index];
    } else {
        color = prf_color_palette_default_values[ index ];
    }

    if ( (color & 0xff000000) != 0xff000000 ) {
        color = prf_color_palette_default_values[ index ];
    }

    /*
    if ( (intensity == 0) || (color == 0)) {
        color = prf_color_palette_default_values[index];
    } else if (0) {
      int b,g,r;
      int a0,a1,r0,r1,b0,b1,g0,g1;
      uint32_t defcol = prf_color_palette_default_values[index];
 
      extract_components(defcol, &a0, &b0, &g0, &r0);
      extract_components(color, &a1, &b1, &g1, &r1);

      a0 = 255 - a1;
      
      b = (b0 * a0 + b1 * a1) >> 8;
      g = (g0 * a0 + g1 * a1) >> 8;
      r = (r0 * a0 + r1 * a1) >> 8;
     
      color = 0xff000000 + (b<<16) + (g<<8) + r;
      }*/
    return color;
}